

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndTabBar(void)

{
  ImVector<ImGuiTabBar_*> *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiTabBar *tab_bar;
  ImGuiContext *pIVar3;
  float fVar4;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    tab_bar = (GImGui->CurrentTabBar).Data[(long)(GImGui->CurrentTabBar).Size + -1];
    if (tab_bar->WantLayout == true) {
      TabBarLayout(tab_bar);
    }
    if (((tab_bar->VisibleTabWasSubmitted == false) && (tab_bar->VisibleTabId != 0)) &&
       (pIVar3->FrameCount <= tab_bar->PrevFrameVisible + 1)) {
      (pIVar2->DC).CursorPos.y = (tab_bar->BarRect).Max.y + tab_bar->ContentsHeight;
    }
    else {
      fVar4 = (pIVar2->DC).CursorPos.y - (tab_bar->BarRect).Max.y;
      tab_bar->ContentsHeight = (float)(-(uint)(0.0 <= fVar4) & (uint)fVar4);
    }
    if ((tab_bar->Flags & 0x100000) == 0) {
      PopID();
    }
    pIVar1 = &pIVar3->CurrentTabBar;
    pIVar1->Size = pIVar1->Size + -1;
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    IM_ASSERT(!g.CurrentTabBar.empty());      // Mismatched BeginTabBar/EndTabBar
    ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
        tab_bar->ContentsHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, 0.0f);
    else
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->ContentsHeight;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();
    g.CurrentTabBar.pop_back();
}